

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

node_t * __thiscall
expression_tree::
node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
::operator=(node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
            *this,operation<std::__cxx11::basic_string<char>_> *f)

{
  operation<std::__cxx11::basic_string<char>_> *f_00;
  branch *this_00;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
  local_58;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
  local_30;
  operation<std::__cxx11::basic_string<char>_> *local_18;
  operation<std::__cxx11::basic_string<char>_> *f_local;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
  *this_local;
  
  local_18 = f;
  f_local = (operation<std::__cxx11::basic_string<char>_> *)this;
  this_00 = (branch *)operator_new(0x80);
  f_00 = local_18;
  node(&local_30,this);
  node(&local_58,this);
  cache_on_evaluation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::sequential>
  ::branch::branch(this_00,f_00,&local_30,&local_58);
  std::
  unique_ptr<expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::reset(&this->impl,(pointer)this_00);
  ~node(&local_58);
  ~node(&local_30);
  if (this->parent != (node_t *)0x0) {
    modified(this->parent);
  }
  return this;
}

Assistant:

node_t& operator=(const detail::operation<T>& f)
	{
		// Create a new branch with the passed operation and two nodes with this node as their parent.
		impl.reset(new typename CachingPolicy<T, ThreadingPolicy>::branch(f, node<T, CachingPolicy, ThreadingPolicy>(this), node<T, CachingPolicy, ThreadingPolicy>(this)));

		if(parent)
		{
			parent->modified();
		}

		return *this;
	}